

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  task_data *ptVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  void *this;
  search *this_00;
  label_parser *lp;
  undefined8 *in_RDX;
  size_t *in_RSI;
  search *in_RDI;
  size_t k;
  option_group_definition new_options;
  task_data *D;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  task_data *in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff858;
  typed_option<unsigned_long> *in_stack_fffffffffffff860;
  typed_option<bool> *in_stack_fffffffffffff898;
  typed_option<bool> *op;
  option_group_definition *in_stack_fffffffffffff8a0;
  ulong local_6d8;
  allocator local_6c9;
  string local_6c8 [39];
  undefined1 local_6a1 [185];
  undefined4 in_stack_fffffffffffffa18;
  uint32_t in_stack_fffffffffffffa1c;
  search *in_stack_fffffffffffffa20;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [359];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [359];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [375];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [56];
  task_data *local_20;
  undefined8 *local_18;
  size_t *local_10;
  search *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ptVar1 = (task_data *)operator_new(0xb8);
  ptVar1->confusion_matrix = (uint32_t *)0x0;
  ptVar1->true_counts = (float *)0x0;
  ptVar1->cur_node = (example *)0x0;
  ptVar1->neighbor_predictions = (float *)0x0;
  (ptVar1->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptVar1->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ptVar1->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ptVar1->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ptVar1->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ptVar1->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptVar1->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptVar1->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptVar1->N = 0;
  ptVar1->E = 0;
  (ptVar1->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptVar1->ss = 0;
  ptVar1->wpp = 0;
  ptVar1->mask = 0;
  ptVar1->multiplier = 0;
  ptVar1->numN = 0;
  ptVar1->use_structure = false;
  ptVar1->separate_learners = false;
  ptVar1->directed = false;
  *(undefined5 *)&ptVar1->field_0x1b = 0;
  ptVar1->num_loops = 0;
  ptVar1->K = 0;
  *(undefined8 *)&ptVar1->true_counts_total = 0;
  task_data::task_data(in_stack_fffffffffffff850);
  local_20 = ptVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"search graphtask options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff850,
             (string *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"search_graph_num_loops",&local_1f1);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff858,&in_stack_fffffffffffff850->num_loops);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"how many loops to run [def: 2]",&local_219);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff850,
             (string *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff850,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff8a0,(typed_option<unsigned_long> *)in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"search_graph_no_structure",&local_381);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"turn off edge features",&local_3a9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (string *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"search_graph_separate_learners",&local_511);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"use a different learner for each pass",&local_539);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (string *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  poVar2 = VW::config::option_group_definition::add<bool>
                     (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  op = (typed_option<bool> *)local_6a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_6a1 + 1),"search_graph_directed",(allocator *)op);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6c8,"construct features based on directed graph semantics",&local_6c9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (string *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff850,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  VW::config::option_group_definition::add<bool>(poVar2,op);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string((string *)(local_6a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6a1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_18)(local_18,local_58);
  local_20->use_structure = (bool)((local_20->use_structure ^ 0xffU) & 1);
  if (local_20->num_loops < 2) {
    local_20->num_loops = 1;
    local_20->separate_learners = false;
  }
  local_20->K = *local_10;
  local_20->numN = (ulong)((local_20->directed & 1) + 1) * (local_20->K + 1);
  poVar3 = std::operator<<((ostream *)&std::cerr,"K=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20->K);
  poVar3 = std::operator<<(poVar3,", numN=");
  this = (void *)std::ostream::operator<<(poVar3,local_20->numN);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = (search *)
            calloc_or_throw<float>(CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  local_20->neighbor_predictions = (float *)this_00;
  lp = (label_parser *)
       calloc_or_throw<unsigned_int>(CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  local_20->confusion_matrix = (uint32_t *)lp;
  poVar2 = (option_group_definition *)
           calloc_or_throw<float>(CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  local_20->true_counts = (float *)poVar2;
  local_20->true_counts_total = (float)(local_20->K + 1);
  for (local_6d8 = 0; local_6d8 <= local_20->K; local_6d8 = local_6d8 + 1) {
    local_20->true_counts[local_6d8] = 1.0;
  }
  if ((local_20->separate_learners & 1U) != 0) {
    Search::search::set_num_learners(local_8,local_20->num_loops);
  }
  Search::search::set_task_data<GraphTask::task_data>(local_8,local_20);
  Search::search::set_options(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  Search::search::set_label_parser(this_00,lp,(_func_bool_polylabel_ptr *)poVar2);
  VW::config::option_group_definition::~option_group_definition(poVar2);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("search graphtask options");
  new_options
      .add(make_option("search_graph_num_loops", D->num_loops).default_value(2).help("how many loops to run [def: 2]"))
      .add(make_option("search_graph_no_structure", D->use_structure).help("turn off edge features"))
      .add(make_option("search_graph_separate_learners", D->separate_learners)
               .help("use a different learner for each pass"))
      .add(make_option("search_graph_directed", D->directed)
               .help("construct features based on directed graph semantics"));
  options.add_and_parse(new_options);

  D->use_structure = !D->use_structure;

  if (D->num_loops <= 1)
  {
    D->num_loops = 1;
    D->separate_learners = false;
  }

  D->K = num_actions;
  D->numN = (D->directed + 1) * (D->K + 1);
  cerr << "K=" << D->K << ", numN=" << D->numN << endl;
  D->neighbor_predictions = calloc_or_throw<float>(D->numN);

  D->confusion_matrix = calloc_or_throw<uint32_t>((D->K + 1) * (D->K + 1));
  D->true_counts = calloc_or_throw<float>(D->K + 1);
  D->true_counts_total = (float)(D->K + 1);
  for (size_t k = 0; k <= D->K; k++) D->true_counts[k] = 1.;

  if (D->separate_learners)
    sch.set_num_learners(D->num_loops);

  sch.set_task_data<task_data>(D);
  sch.set_options(0);  // Search::AUTO_HAMMING_LOSS
  sch.set_label_parser(COST_SENSITIVE::cs_label, example_is_test);
}